

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O2

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<soul::TokenType&,char_const*&>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          CodeLocation *location,Type type,char *text,TokenType *args,char **args_1)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  size_t i;
  long lVar1;
  ulong index;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_13a;
  allocator<char> local_139;
  Category local_138;
  Type local_134;
  CodeLocation *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  string result;
  string local_f0;
  string local_d0 [32];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50;
  
  local_130 = (CodeLocation *)CONCAT44(in_register_00000014,category);
  local_134 = (Type)location;
  local_138 = (Category)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,(char *)CONCAT44(in_register_00000084,type),
             (allocator<char> *)&local_90);
  TokenType::getDescription_abi_cxx11_(&local_b0,(TokenType *)text);
  std::__cxx11::string::string((string *)&local_90,(string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,args->text,&local_139);
  std::__cxx11::string::string(local_70,local_d0);
  __l._M_len = 2;
  __l._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&stringArgs,__l,&local_13a);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  lVar1 = 0;
  for (index = 0;
      index < (ulong)((long)stringArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)stringArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); index = index + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)&result);
    replaceArgument(&local_90,&local_50,index,
                    (string *)
                    ((long)&((stringArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1)
                   );
    std::__cxx11::string::operator=((string *)&result,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = lVar1 + 0x20;
  }
  std::__cxx11::string::string((string *)&local_f0,(string *)&result);
  choc::text::trim(&__return_storage_ptr__->description,&local_f0);
  CodeLocation::CodeLocation(&__return_storage_ptr__->location,local_130);
  __return_storage_ptr__->type = local_134;
  __return_storage_ptr__->category = local_138;
  std::__cxx11::string::~string((string *)&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&stringArgs);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }